

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> *node)

{
  pointer pBVar1;
  unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pBVar1 = std::unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pBVar1->left);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BinaryOp_*,_std::default_delete<verilogAST::BinaryOp>_>
              .super__Head_base<0UL,_verilogAST::BinaryOp_*,_false>._M_head_impl)->super_Expression)
            .super_Node)(local_28,node,&local_30);
  pBVar1 = std::unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pBVar1->left,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  pBVar1 = std::unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_50,&pBVar1->right);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::BinaryOp_*,_std::default_delete<verilogAST::BinaryOp>_>
              .super__Head_base<0UL,_verilogAST::BinaryOp_*,_false>._M_head_impl)->super_Expression)
            .super_Node)(local_48,node,&local_50);
  pBVar1 = std::unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pBVar1->right,local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_50);
  std::unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_>::unique_ptr
            ((unique_ptr<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>,_true,_true>
          )(__uniq_ptr_data<verilogAST::BinaryOp,_std::default_delete<verilogAST::BinaryOp>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BinaryOp> Transformer::visit(std::unique_ptr<BinaryOp> node) {
  node->left = this->visit(std::move(node->left));
  node->right = this->visit(std::move(node->right));
  return node;
}